

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_descent_parser.cpp
# Opt level: O0

JsonValue * __thiscall MercuryJson::JSON::_parse_value(JSON *this)

{
  ulong *puVar1;
  ulong idx_00;
  runtime_error *this_00;
  longlong value_00;
  JsonValue *pJVar2;
  undefined1 args;
  JSON *in_RDI;
  JSON *in_stack_00000008;
  longlong ret;
  bool is_decimal;
  JsonValue *value;
  char ch;
  size_t idx;
  size_t in_stack_00000138;
  bool *in_stack_00000140;
  char *in_stack_00000148;
  size_t in_stack_00000188;
  char in_stack_00000197;
  char *in_stack_00000198;
  JSON *in_stack_000001a0;
  char *in_stack_ffffffffffffff98;
  BlockAllocator<MercuryJson::JsonValue> *in_stack_ffffffffffffffa0;
  BlockAllocator<MercuryJson::JsonValue> *this_01;
  undefined7 in_stack_ffffffffffffffc8;
  byte in_stack_ffffffffffffffcf;
  char *in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  
  puVar1 = in_RDI->idx_ptr;
  in_RDI->idx_ptr = puVar1 + 1;
  idx_00 = *puVar1;
  if (idx_00 < in_RDI->input_len) {
    uVar3 = CONCAT13(in_RDI->input[idx_00],in_stack_ffffffffffffffd8);
    switch(in_RDI->input[idx_00]) {
    case '\"':
      this_01 = &in_RDI->allocator;
      _parse_str(in_RDI,idx_00);
      pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue,char*>
                         (this_01,in_stack_ffffffffffffff98);
      break;
    default:
      _error(in_stack_000001a0,in_stack_00000198,in_stack_00000197,in_stack_00000188);
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      value_00 = parse_number(in_stack_00000148,in_stack_00000140,in_stack_00000138);
      if ((in_stack_ffffffffffffffcf & 1) == 0) {
        pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue,long_long>
                           (in_stack_ffffffffffffffa0,(longlong)in_stack_ffffffffffffff98);
      }
      else {
        plain_convert(value_00);
        pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue,double>
                           (in_stack_ffffffffffffffa0,(double)in_stack_ffffffffffffff98);
      }
      break;
    case '[':
      pJVar2 = _parse_array((JSON *)CONCAT44(in_stack_ffffffffffffffdc,uVar3));
      break;
    case 'f':
      parse_false(in_stack_ffffffffffffffe0,CONCAT44(in_stack_ffffffffffffffdc,uVar3));
      pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue,bool>
                         (in_stack_ffffffffffffffa0,
                          SUB81((ulong)in_stack_ffffffffffffff98 >> 0x38,0));
      break;
    case 'n':
      parse_null(in_stack_ffffffffffffffd0,
                 CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue>
                         (in_stack_ffffffffffffffa0);
      break;
    case 't':
      args = (undefined1)((ulong)&in_RDI->allocator >> 0x38);
      parse_true(in_stack_ffffffffffffffd0,
                 CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      pJVar2 = BlockAllocator<MercuryJson::JsonValue>::construct<MercuryJson::JsonValue,bool>
                         (in_stack_ffffffffffffffa0,(bool)args);
      break;
    case '{':
      pJVar2 = _parse_object(in_stack_00000008);
    }
    return pJVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"text ended prematurely");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

JsonValue *JSON::_parse_value() {
        size_t idx;
        char ch;
        next_char();
        JsonValue *value;
        switch (ch) {
            case '"':
                value = allocator.construct(_parse_str(idx));
                break;
            case 't':
                value = allocator.construct(parse_true(input, idx));
                break;
            case 'f':
                value = allocator.construct(parse_false(input, idx));
                break;
            case 'n':
                parse_null(input, idx);
                value = allocator.construct();
                break;
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            case '-': {
                bool is_decimal;
                long long int ret = parse_number(input, &is_decimal, idx);
                if (is_decimal) value = allocator.construct(plain_convert(ret));
                else value = allocator.construct(ret);
                break;
            }
            case '[':
                value = _parse_array();
                break;
            case '{':
                value = _parse_object();
                break;
            default:
                error("JSON value");
        }
        return value;
    }